

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
          (undefined8 param_1,long_string_storage *param_2)

{
  long_string_storage *this;
  json_const_reference_storage temp;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  
  cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
            (in_stack_ffffffffffffffc0);
  this = cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             param_2);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             (json_const_reference_storage *)param_2);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }